

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_stats.cpp
# Opt level: O0

BaseStatistics * duckdb::StructStats::CreateUnknown(LogicalType *type)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this;
  BaseStatistics *pBVar1;
  BaseStatistics *in_RDI;
  idx_t i;
  child_list_t<LogicalType> *child_types;
  BaseStatistics *result;
  const_reference in_stack_ffffffffffffff08;
  type in_stack_ffffffffffffff10;
  BaseStatistics *other;
  BaseStatistics *this_00;
  LogicalType *in_stack_ffffffffffffff48;
  BaseStatistics *in_stack_ffffffffffffff50;
  BaseStatistics *local_50;
  
  this_00 = in_RDI;
  this = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          *)StructType::GetChildTypes_abi_cxx11_(&in_stack_ffffffffffffff10->type);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffff10->type,(LogicalType *)in_stack_ffffffffffffff08);
  BaseStatistics::BaseStatistics(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  LogicalType::~LogicalType((LogicalType *)0xb72a0b);
  BaseStatistics::InitializeUnknown(in_RDI);
  local_50 = (BaseStatistics *)0x0;
  while (other = local_50,
        pBVar1 = (BaseStatistics *)
                 ::std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 ::size(this), other < pBVar1) {
    in_stack_ffffffffffffff10 =
         unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics>,_false>::
         operator[]((unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics>,_false>
                     *)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff08 =
         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
         ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                       *)in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
    LogicalType::LogicalType
              (&in_stack_ffffffffffffff10->type,(LogicalType *)in_stack_ffffffffffffff08);
    BaseStatistics::CreateUnknown(in_stack_ffffffffffffff48);
    BaseStatistics::Copy(this_00,other);
    BaseStatistics::~BaseStatistics(in_stack_ffffffffffffff10);
    LogicalType::~LogicalType((LogicalType *)0xb72ace);
    local_50 = (BaseStatistics *)&(local_50->type).physical_type_;
  }
  return this_00;
}

Assistant:

BaseStatistics StructStats::CreateUnknown(LogicalType type) {
	auto &child_types = StructType::GetChildTypes(type);
	BaseStatistics result(std::move(type));
	result.InitializeUnknown();
	for (idx_t i = 0; i < child_types.size(); i++) {
		result.child_stats[i].Copy(BaseStatistics::CreateUnknown(child_types[i].second));
	}
	return result;
}